

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uniset.cpp
# Opt level: O0

void icu_63::UnicodeSet::_appendToPat(UnicodeString *buf,UChar32 c,UBool escapeUnprintable)

{
  UBool UVar1;
  UBool escapeUnprintable_local;
  UChar32 c_local;
  UnicodeString *buf_local;
  
  if (((escapeUnprintable == '\0') || (UVar1 = ICU_Utility::isUnprintable(c), UVar1 == '\0')) ||
     (UVar1 = ICU_Utility::escapeUnprintable(buf,c), UVar1 == '\0')) {
    switch(c) {
    case 0x24:
    case 0x26:
    case 0x2d:
    case 0x3a:
    case 0x5b:
    case 0x5c:
    case 0x5d:
    case 0x5e:
    case 0x7b:
    case 0x7d:
      UnicodeString::append(buf,L'\\');
      break;
    default:
      UVar1 = PatternProps::isWhiteSpace(c);
      if (UVar1 != '\0') {
        UnicodeString::append(buf,L'\\');
      }
    }
    UnicodeString::append(buf,c);
  }
  return;
}

Assistant:

void UnicodeSet::_appendToPat(UnicodeString& buf, UChar32 c, UBool
escapeUnprintable) {
    if (escapeUnprintable && ICU_Utility::isUnprintable(c)) {
        // Use hex escape notation (\uxxxx or \Uxxxxxxxx) for anything
        // unprintable
        if (ICU_Utility::escapeUnprintable(buf, c)) {
            return;
        }
    }
    // Okay to let ':' pass through
    switch (c) {
    case SET_OPEN:
    case SET_CLOSE:
    case HYPHEN:
    case COMPLEMENT:
    case INTERSECTION:
    case BACKSLASH:
    case OPEN_BRACE:
    case CLOSE_BRACE:
    case COLON:
    case SymbolTable::SYMBOL_REF:
        buf.append(BACKSLASH);
        break;
    default:
        // Escape whitespace
        if (PatternProps::isWhiteSpace(c)) {
            buf.append(BACKSLASH);
        }
        break;
    }
    buf.append(c);
}